

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SparseSupportVectors::SparseSupportVectors(SparseSupportVectors *this)

{
  SparseSupportVectors *pSVar1;
  SparseSupportVectors *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SparseSupportVectors_00575218;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::SparseVector>::RepeatedPtrField
            (&this->vectors_);
  pSVar1 = internal_default_instance();
  if (this != pSVar1) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

SparseSupportVectors::SparseSupportVectors()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.SparseSupportVectors)
}